

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void idr_register(idr *idr,isoent *isoent,int weight,int noff)

{
  int iVar1;
  idrent *self;
  idrent *piVar2;
  idrent *n;
  idrent *idrent;
  int noff_local;
  int weight_local;
  isoent *isoent_local;
  idr *idr_local;
  
  iVar1 = idr->pool_idx;
  idr->pool_idx = iVar1 + 1;
  self = idr->idrent_pool + iVar1;
  self->avail = (idrent *)0x0;
  self->wnext = (idrent *)0x0;
  self->isoent = isoent;
  self->weight = weight;
  self->noff = noff;
  self->rename_num = 0;
  iVar1 = __archive_rb_tree_insert_node(&idr->rbtree,&self->rbnode);
  if ((iVar1 == 0) &&
     (piVar2 = (idrent *)__archive_rb_tree_find_node(&idr->rbtree,self->isoent),
     piVar2 != (idrent *)0x0)) {
    self->avail = piVar2;
    *(idr->wait_list).last = self;
    (idr->wait_list).last = &self->wnext;
  }
  return;
}

Assistant:

static void
idr_register(struct idr *idr, struct isoent *isoent, int weight, int noff)
{
	struct idrent *idrent, *n;

	idrent = &(idr->idrent_pool[idr->pool_idx++]);
	idrent->wnext = idrent->avail = NULL;
	idrent->isoent = isoent;
	idrent->weight = weight;
	idrent->noff = noff;
	idrent->rename_num = 0;

	if (!__archive_rb_tree_insert_node(&(idr->rbtree), &(idrent->rbnode))) {
		n = (struct idrent *)__archive_rb_tree_find_node(
		    &(idr->rbtree), idrent->isoent);
		if (n != NULL) {
			/* this `idrent' needs to rename. */
			idrent->avail = n;
			*idr->wait_list.last = idrent;
			idr->wait_list.last = &(idrent->wnext);
		}
	}
}